

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUtil.c
# Opt level: O1

int Abc_NtkCrossCut_rec(Abc_Obj_t *pObj,int *pnCutSize,int *pnCutSizeMax)

{
  int iVar1;
  Abc_Ntk_t *pAVar2;
  Abc_Ntk_t *pAVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  int Fill;
  int iVar7;
  long lVar8;
  
  uVar6 = *(uint *)&pObj->field_0x14 & 0xf;
  uVar4 = 0;
  if ((uVar6 != 2) && (uVar6 != 5)) {
    pAVar2 = pObj->pNtk;
    iVar7 = pObj->Id;
    Vec_IntFillExtra(&pAVar2->vTravIds,iVar7 + 1,(int)pnCutSizeMax);
    if (((long)iVar7 < 0) || ((pAVar2->vTravIds).nSize <= iVar7)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    pAVar3 = pObj->pNtk;
    iVar5 = pAVar3->nTravIds;
    if ((pAVar2->vTravIds).pArray[iVar7] != iVar5) {
      iVar7 = pObj->Id;
      Vec_IntFillExtra(&pAVar3->vTravIds,iVar7 + 1,Fill);
      if (((long)iVar7 < 0) || ((pAVar3->vTravIds).nSize <= iVar7)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      (pAVar3->vTravIds).pArray[iVar7] = iVar5;
      uVar4 = *(uint *)&pObj->field_0x14 & 0xf;
      iVar7 = 0;
      if (((uVar4 != 2) && (uVar4 != 5)) && (0 < (pObj->vFanins).nSize)) {
        lVar8 = 0;
        iVar7 = 0;
        do {
          iVar5 = Abc_NtkCrossCut_rec((Abc_Obj_t *)
                                      pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[lVar8]],
                                      pnCutSize,pnCutSizeMax);
          iVar7 = iVar7 + iVar5;
          lVar8 = lVar8 + 1;
        } while (lVar8 < (pObj->vFanins).nSize);
      }
      iVar1 = *pnCutSize;
      iVar5 = iVar1 + 1;
      *pnCutSize = iVar5;
      if (*pnCutSizeMax <= iVar1) {
        *pnCutSizeMax = iVar5;
      }
      *pnCutSize = *pnCutSize - iVar7;
    }
    iVar7 = (pObj->field_6).iTemp + 1;
    pObj->field_6 = (anon_union_8_4_617c9805_for_Abc_Obj_t__17)(long)iVar7;
    uVar4 = (uint)(iVar7 == (pObj->vFanouts).nSize);
  }
  return uVar4;
}

Assistant:

int Abc_NtkCrossCut_rec( Abc_Obj_t * pObj, int * pnCutSize, int * pnCutSizeMax )
{
    Abc_Obj_t * pFanin;
    int i, nDecrem = 0;
    int fReverse = 0;
    if ( Abc_ObjIsCi(pObj) )
        return 0;
    // if visited, increment visit counter 
    if ( Abc_NodeIsTravIdCurrent( pObj ) )
        return Abc_ObjCrossCutInc( pObj );
    Abc_NodeSetTravIdCurrent( pObj );
    // visit the fanins
    if ( !Abc_ObjIsCi(pObj) )
    {
        if ( fReverse )
        {
            Abc_ObjForEachFanin( pObj, pFanin, i )
            {
                pFanin = Abc_ObjFanin( pObj, Abc_ObjFaninNum(pObj) - 1 - i );
                nDecrem += Abc_NtkCrossCut_rec( pFanin, pnCutSize, pnCutSizeMax );
            }
        }
        else
        {
            Abc_ObjForEachFanin( pObj, pFanin, i )
                nDecrem += Abc_NtkCrossCut_rec( pFanin, pnCutSize, pnCutSizeMax );
        }
    }
    // count the node
    (*pnCutSize)++;
    if ( *pnCutSizeMax < *pnCutSize )
        *pnCutSizeMax = *pnCutSize;
    (*pnCutSize) -= nDecrem;
    return Abc_ObjCrossCutInc( pObj );
}